

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void arena_slab_reg_alloc_batch(edata_t *slab,bin_info_t *bin_info,uint cnt,void **ptrs)

{
  void *pvVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  bitmap_t bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  
  bVar6 = (slab->field_6).e_slab_data.bitmap[0];
  uVar4 = 0;
  uVar9 = 0;
  while (uVar5 = cnt - uVar4, uVar4 <= cnt && uVar5 != 0) {
    uVar10 = (int)uVar9 << 6;
    while (bVar6 == 0) {
      uVar9 = (ulong)((int)uVar9 + 1);
      uVar10 = uVar10 + 0x40;
      bVar6 = *(ulong *)((long)&slab->field_6 + uVar9 * 8);
    }
    uVar8 = bVar6 - (bVar6 >> 1 & 0x5555555555555555);
    uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
    uVar7 = (uint)(byte)(((uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
    if (uVar5 < uVar7) {
      uVar7 = uVar5;
    }
    uVar8 = (ulong)uVar7;
    pvVar1 = slab->e_addr;
    sVar2 = bin_info->reg_size;
    while (bVar11 = uVar8 != 0, uVar8 = uVar8 - 1, bVar11) {
      uVar3 = 0;
      if (bVar6 != 0) {
        for (; (bVar6 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      bVar6 = bVar6 ^ 1L << (uVar3 & 0x3f);
      ptrs[uVar4] = (void *)((uVar3 | uVar10) * sVar2 + (long)pvVar1);
      uVar4 = uVar4 + 1;
    }
    *(bitmap_t *)((long)&slab->field_6 + uVar9 * 8) = bVar6;
  }
  slab->e_bits = slab->e_bits + (ulong)cnt * -0x10000000;
  return;
}

Assistant:

static void
arena_slab_reg_alloc_batch(edata_t *slab, const bin_info_t *bin_info,
			   unsigned cnt, void** ptrs) {
	slab_data_t *slab_data = edata_slab_data_get(slab);

	assert(edata_nfree_get(slab) >= cnt);
	assert(!bitmap_full(slab_data->bitmap, &bin_info->bitmap_info));

#if (! defined JEMALLOC_INTERNAL_POPCOUNTL) || (defined BITMAP_USE_TREE)
	for (unsigned i = 0; i < cnt; i++) {
		size_t regind = bitmap_sfu(slab_data->bitmap,
					   &bin_info->bitmap_info);
		*(ptrs + i) = (void *)((uintptr_t)edata_addr_get(slab) +
		    (uintptr_t)(bin_info->reg_size * regind));
	}
#else
	unsigned group = 0;
	bitmap_t g = slab_data->bitmap[group];
	unsigned i = 0;
	while (i < cnt) {
		while (g == 0) {
			g = slab_data->bitmap[++group];
		}
		size_t shift = group << LG_BITMAP_GROUP_NBITS;
		size_t pop = popcount_lu(g);
		if (pop > (cnt - i)) {
			pop = cnt - i;
		}

		/*
		 * Load from memory locations only once, outside the
		 * hot loop below.
		 */
		uintptr_t base = (uintptr_t)edata_addr_get(slab);
		uintptr_t regsize = (uintptr_t)bin_info->reg_size;
		while (pop--) {
			size_t bit = cfs_lu(&g);
			size_t regind = shift + bit;
			/* NOLINTNEXTLINE(performance-no-int-to-ptr) */
			*(ptrs + i) = (void *)(base + regsize * regind);

			i++;
		}
		slab_data->bitmap[group] = g;
	}
#endif
	edata_nfree_sub(slab, cnt);
}